

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IGXMLScanner2.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::IGXMLScanner::parseSchemaLocation
          (IGXMLScanner *this,XMLCh *schemaLocationStr,bool ignoreLoadSchema)

{
  short *psVar1;
  MemoryManager *pMVar2;
  ulong uVar3;
  XMLCh *loc;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char16_t **ppcVar5;
  size_t __n;
  XMLSize_t getAt;
  XMLBuffer normalBuf;
  ArrayJanitor<char16_t> janLoc;
  XMLBuffer local_78;
  ArrayJanitor<char16_t> local_40;
  char16_t *toDelete;
  
  if (schemaLocationStr == (XMLCh *)0x0) {
    toDelete = (char16_t *)0x0;
  }
  else {
    pMVar2 = (this->super_XMLScanner).fMemoryManager;
    __n = 0;
    do {
      psVar1 = (short *)((long)schemaLocationStr + __n);
      __n = __n + 2;
    } while (*psVar1 != 0);
    iVar4 = (*pMVar2->_vptr_MemoryManager[3])(pMVar2,__n);
    toDelete = (char16_t *)CONCAT44(extraout_var,iVar4);
    memcpy(toDelete,schemaLocationStr,__n);
  }
  ArrayJanitor<char16_t>::ArrayJanitor(&local_40,toDelete,(this->super_XMLScanner).fMemoryManager);
  processSchemaLocation(this,toDelete);
  uVar3 = this->fLocationPairs->fCurCount;
  if ((uVar3 & 1) == 0) {
    local_78.fMemoryManager = (this->super_XMLScanner).fMemoryManager;
    local_78.fIndex = 0;
    local_78.fCapacity = 0x3ff;
    local_78.fFullSize = 0;
    local_78.fUsed = false;
    local_78.fFullHandler = (XMLBufferFullHandler *)0x0;
    local_78.fBuffer = (XMLCh *)0x0;
    iVar4 = (*(local_78.fMemoryManager)->_vptr_MemoryManager[3])(local_78.fMemoryManager,0x800);
    local_78.fBuffer = (XMLCh *)CONCAT44(extraout_var_00,iVar4);
    *local_78.fBuffer = L'\0';
    if (uVar3 != 0) {
      getAt = 0;
      do {
        ppcVar5 = ValueVectorOf<char16_t_*>::elementAt(this->fLocationPairs,getAt);
        normalizeAttRawValue(this,L"schemaLocation",*ppcVar5,&local_78);
        ppcVar5 = ValueVectorOf<char16_t_*>::elementAt(this->fLocationPairs,getAt + 1);
        loc = *ppcVar5;
        local_78.fBuffer[local_78.fIndex] = L'\0';
        resolveSchemaGrammar(this,loc,local_78.fBuffer,ignoreLoadSchema);
        getAt = getAt + 2;
      } while (getAt < uVar3);
    }
    (*(local_78.fMemoryManager)->_vptr_MemoryManager[4])(local_78.fMemoryManager,local_78.fBuffer);
  }
  else {
    XMLScanner::emitError(&this->super_XMLScanner,BadSchemaLocation);
  }
  ArrayJanitor<char16_t>::~ArrayJanitor(&local_40);
  return;
}

Assistant:

void IGXMLScanner::parseSchemaLocation(const XMLCh* const schemaLocationStr, bool ignoreLoadSchema)
{
    XMLCh* locStr = XMLString::replicate(schemaLocationStr, fMemoryManager);
    ArrayJanitor<XMLCh> janLoc(locStr, fMemoryManager);

    processSchemaLocation(locStr);
    XMLSize_t size = fLocationPairs->size();

    if (size % 2 != 0 ) {
        emitError(XMLErrs::BadSchemaLocation);
    } else {
        // We need a buffer to normalize the attribute value into
        XMLBuffer normalBuf(1023, fMemoryManager);
        for(XMLSize_t i=0; i<size; i=i+2) {
            normalizeAttRawValue(SchemaSymbols::fgXSI_SCHEMALOCATION, fLocationPairs->elementAt(i), normalBuf);
            resolveSchemaGrammar(fLocationPairs->elementAt(i+1), normalBuf.getRawBuffer(), ignoreLoadSchema);
        }
    }
}